

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

optional<long_long> anon_unknown.dwarf_7eee46::qConvertToNumber(Private *d,bool allowStringToBool)

{
  bool bVar1;
  int iVar2;
  QChar *this;
  QMetaTypeInterface *pQVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 uVar4;
  byte in_SIL;
  Private *in_RDI;
  long in_FS_OFFSET;
  optional<long_long> oVar5;
  QString *s;
  qlonglong l_1;
  qlonglong l;
  bool ok;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  QString *in_stack_fffffffffffffef8;
  QByteArray *in_stack_ffffffffffffff00;
  bool local_e9;
  bool local_d1;
  _Storage<long_long,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::Private::typeInterface(in_RDI);
  iVar2 = QBasicAtomicInteger::operator_cast_to_int((QBasicAtomicInteger<int> *)0x439e44);
  switch(iVar2) {
  case 1:
    ::QVariant::Private::get<bool>((Private *)0x43a0fb);
    std::optional<long_long>::optional<long_long,_true>
              ((optional<long_long> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (longlong *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    uVar4 = extraout_RDX_04;
    break;
  case 3:
  case 5:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x38:
  case 0x39:
    qMetaTypeUNumber((Private *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::optional<long_long>::optional<long_long,_true>
              ((optional<long_long> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (longlong *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    uVar4 = extraout_RDX_07;
    break;
  case 7:
    this = ::QVariant::Private::get<QChar>((Private *)0x43a06a);
    QChar::unicode(this);
    std::optional<long_long>::optional<char16_t,_true>
              ((optional<long_long> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (char16_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    uVar4 = extraout_RDX_02;
    break;
  default:
switchD_00439e69_caseD_8:
    pQVar3 = ::QVariant::Private::typeInterface(in_RDI);
    if ((pQVar3->flags & 0x10) == 0) {
      ::QVariant::Private::typeInterface(in_RDI);
      iVar2 = QBasicAtomicInteger::operator_cast_to_int((QBasicAtomicInteger<int> *)0x43a215);
      if (iVar2 != 0x34) {
        std::optional<long_long>::optional((optional<long_long> *)&local_18);
        uVar4 = extraout_RDX_09;
        break;
      }
    }
    qMetaTypeNumberBySize((Private *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::optional<long_long>::optional<long_long,_true>
              ((optional<long_long> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (longlong *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    uVar4 = extraout_RDX_08;
    break;
  case 10:
    ::QVariant::Private::get<QString>((Private *)0x439e85);
    QString::toLongLong(in_stack_fffffffffffffef8,
                        (bool *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffeec);
    if ((in_SIL & 1) != 0) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      bVar1 = ::operator==(in_stack_fffffffffffffef8,
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_d1 = true;
      if (!bVar1) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffef8,
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        local_d1 = ::operator==(in_stack_fffffffffffffef8,
                                (QLatin1StringView *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      }
      if (local_d1 != false) {
        std::optional<long_long>::optional<int,_true>
                  ((optional<long_long> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        uVar4 = extraout_RDX;
        break;
      }
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffef8,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      bVar1 = ::operator==(in_stack_fffffffffffffef8,
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_e9 = true;
      if (!bVar1) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffef8,
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        local_e9 = ::operator==(in_stack_fffffffffffffef8,
                                (QLatin1StringView *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      }
      if (local_e9 != false) {
        std::optional<long_long>::optional<int,_true>
                  ((optional<long_long> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        uVar4 = extraout_RDX_00;
        break;
      }
    }
    std::optional<long_long>::optional((optional<long_long> *)&local_18);
    uVar4 = extraout_RDX_01;
    break;
  case 0xc:
    ::QVariant::Private::get<QByteArray>((Private *)0x43a09e);
    QByteArray::toLongLong
              (in_stack_ffffffffffffff00,(bool *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4
              );
    std::optional<long_long>::optional((optional<long_long> *)&local_18);
    uVar4 = extraout_RDX_03;
    break;
  case 0x2d:
    ::QVariant::Private::get<QJsonValue>((Private *)0x43a18b);
    bVar1 = QJsonValue::isDouble((QJsonValue *)0x43a193);
    if (!bVar1) goto switchD_00439e69_caseD_8;
  case 2:
  case 4:
  case 6:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x26:
  case 0x28:
    qMetaTypeNumber((Private *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::optional<long_long>::optional<long_long,_true>
              ((optional<long_long> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (longlong *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    uVar4 = extraout_RDX_06;
    break;
  case 0x35:
    ::QVariant::Private::get<QCborValue>((Private *)0x43a12e);
    bVar1 = ::QCborValue::isInteger((QCborValue *)0x43a136);
    if (!bVar1) {
      ::QVariant::Private::get<QCborValue>((Private *)0x43a144);
      bVar1 = ::QCborValue::isDouble((QCborValue *)0x43a14c);
      if (!bVar1) goto switchD_00439e69_caseD_8;
    }
    qMetaTypeNumber((Private *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::optional<long_long>::optional<long_long,_true>
              ((optional<long_long> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (longlong *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    uVar4 = extraout_RDX_05;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_engaged = (bool)local_10;
  oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value = local_18._M_value;
  return (optional<long_long>)
         oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

static std::optional<qlonglong> qConvertToNumber(const QVariant::Private *d, bool allowStringToBool = false)
{
    bool ok;
    switch (d->typeInterface()->typeId) {
    case QMetaType::QString: {
        const QString &s = d->get<QString>();
        if (qlonglong l = s.toLongLong(&ok); ok)
            return l;
        if (allowStringToBool) {
            if (s == "false"_L1 || s == "0"_L1)
                return 0;
            if (s == "true"_L1 || s == "1"_L1)
                return 1;
        }
        return std::nullopt;
    }
    case QMetaType::QChar:
        return d->get<QChar>().unicode();
    case QMetaType::QByteArray:
        if (qlonglong l = d->get<QByteArray>().toLongLong(&ok); ok)
            return l;
        return std::nullopt;
    case QMetaType::Bool:
        return qlonglong(d->get<bool>());
    case QMetaType::QCborValue:
        if (!d->get<QCborValue>().isInteger() && !d->get<QCborValue>().isDouble())
            break;
        return qMetaTypeNumber(d);
    case QMetaType::QJsonValue:
        if (!d->get<QJsonValue>().isDouble())
            break;
        Q_FALLTHROUGH();
    case QMetaType::Double:
    case QMetaType::Int:
    case QMetaType::Char:
    case QMetaType::SChar:
    case QMetaType::Short:
    case QMetaType::Long:
    case QMetaType::Float:
    case QMetaType::LongLong:
        return qMetaTypeNumber(d);
    case QMetaType::ULongLong:
    case QMetaType::UInt:
    case QMetaType::UChar:
    case QMetaType::Char16:
    case QMetaType::Char32:
    case QMetaType::UShort:
    case QMetaType::ULong:
        return qlonglong(qMetaTypeUNumber(d));
    }

    if (d->typeInterface()->flags & QMetaType::IsEnumeration
        || d->typeInterface()->typeId == QMetaType::QCborSimpleType)
        return qMetaTypeNumberBySize(d);

    return std::nullopt;
}